

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseClicked(ImGuiMouseButton button,ImGuiID owner_id,ImGuiInputFlags flags)

{
  float *pfVar1;
  float t1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  ImGuiKey in_EDX;
  int in_EDI;
  bool pressed;
  bool repeat;
  float t;
  ImGuiContext *g;
  bool local_1;
  
  pIVar2 = GImGui;
  if (((GImGui->IO).MouseDown[in_EDI] & 1U) == 0) {
    local_1 = false;
  }
  else {
    t1 = (GImGui->IO).MouseDownDuration[in_EDI];
    if (0.0 <= t1) {
      bVar3 = true;
      if ((((t1 != 0.0) || (NAN(t1))) && (bVar3 = false, (in_EDX & 1) != ImGuiKey_KeysData_OFFSET))
         && (pfVar1 = &(GImGui->IO).KeyRepeatDelay, bVar3 = false, *pfVar1 <= t1 && t1 != *pfVar1))
      {
        iVar4 = CalcTypematicRepeatAmount
                          (t1 - (GImGui->IO).DeltaTime,t1,(GImGui->IO).KeyRepeatDelay,
                           (GImGui->IO).KeyRepeatRate);
        bVar3 = 0 < iVar4;
      }
      if (bVar3) {
        MouseButtonToKey(in_EDI);
        bVar3 = TestKeyOwner(in_EDX,(ImGuiID)((ulong)pIVar2 >> 0x20));
        if (bVar3) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button]) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = g.IO.MouseDownDuration[button];
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!

    const bool repeat = (flags & ImGuiInputFlags_Repeat) != 0;
    const bool pressed = (t == 0.0f) || (repeat && t > g.IO.KeyRepeatDelay && CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0);
    if (!pressed)
        return false;

    if (!TestKeyOwner(MouseButtonToKey(button), owner_id))
        return false;

    return true;
}